

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Code.cpp
# Opt level: O2

void Code::FinalShell(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Runtime *this;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  unsigned_long *pos;
  Bracket *this_00;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Final Is Not Another Lisp!");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,">>> ");
  this = (Runtime *)operator_new(8);
  Runtime::Runtime(this);
  str = (string *)operator_new(0x20);
  (str->_M_dataplus)._M_p = (pointer)&str->field_2;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (__lhs->_M_dataplus)._M_p = (pointer)&__lhs->field_2;
  __lhs->_M_string_length = 0;
  (__lhs->field_2)._M_local_buf[0] = '\0';
  pos = (unsigned_long *)operator_new(8);
  *pos = 0;
  do {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)str);
    while( true ) {
      bVar1 = isValidCode(str);
      if (bVar1) break;
      std::operator<<((ostream *)&std::cout,"... ");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)__lhs);
      bVar1 = std::operator==(__lhs,"");
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)str);
        break;
      }
      std::operator+(&local_50," ",__lhs);
      std::__cxx11::string::append((string *)str);
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar1 = std::operator==(str,"");
    if (bVar1) {
      Runtime::~Runtime(this);
      operator_delete(this);
      std::__cxx11::string::~string((string *)__lhs);
      operator_delete(__lhs);
      operator_delete(pos);
      return;
    }
    *pos = 0;
    this_00 = (Bracket *)operator_new(0x40);
    Bracket::Bracket(this_00,str,pos);
    iVar2 = (*(this_00->super_Atom)._vptr_Atom[3])(this_00,this);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
              ((long *)CONCAT44(extraout_var,iVar2));
    (*(this_00->super_Atom)._vptr_Atom[1])(this_00);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,">>> ");
  } while( true );
}

Assistant:

void Code::FinalShell() {
    std::cout << "Final Is Not Another Lisp!" << std::endl;
    std::cout << ">>> ";
    auto runtime = new Runtime();
    auto sourceCode = new std::string;
    auto temp = new std::string;
    auto pos = new unsigned long(0);
    Bracket *bracket;
    while (true) {
        std::getline(std::cin, *sourceCode);
        while (!isValidCode(*sourceCode)) {
            std::cout << "... ";
            std::getline(std::cin, *temp);
            if (*temp == "") {
                *sourceCode = *temp;
                break;
            }
            *sourceCode += " " + *temp;
        }
        if (*sourceCode == "") {
            break;
        }
        *pos = 0;
        bracket = new Bracket(*sourceCode, *pos);
        bracket->eval(runtime)->print();
        delete bracket;
        std::cout << std::endl;
        std::cout << ">>> ";
    }
    delete runtime;
    delete temp;
    delete pos;
}